

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O1

int archive_write_client_open(archive_write_filter *f)

{
  archive *a_00;
  archive *a_01;
  int iVar1;
  size_t *__ptr;
  void *__ptr_00;
  uint uVar2;
  uint uVar3;
  size_t __size;
  archive_write *a;
  archive_write *a_1;
  
  a_00 = f->archive;
  iVar1 = __archive_check_magic(a_00,0xb0c5c0de,0x7fff,"archive_write_get_bytes_per_block");
  uVar3 = 0xffffffe2;
  uVar2 = 0xffffffe2;
  if (iVar1 != -0x1e) {
    uVar2 = 1;
    if (-1 < (int)a_00[1].current_codepage) {
      uVar2 = a_00[1].current_codepage;
    }
  }
  f->bytes_per_block = uVar2;
  a_01 = f->archive;
  iVar1 = __archive_check_magic(a_01,0xb0c5c0de,0x7fff,"archive_write_get_bytes_in_last_block");
  if (iVar1 != -0x1e) {
    uVar3 = a_01[1].current_oemcp;
  }
  f->bytes_in_last_block = uVar3;
  __size = (size_t)f->bytes_per_block;
  __ptr = (size_t *)calloc(1,0x20);
  __ptr_00 = malloc(__size);
  if (__ptr == (size_t *)0x0 || __ptr_00 == (void *)0x0) {
    free(__ptr);
    free(__ptr_00);
    archive_set_error(f->archive,0xc,"Can\'t allocate data for output buffering");
    iVar1 = -0x1e;
  }
  else {
    *__ptr = __size;
    __ptr[2] = (size_t)__ptr_00;
    __ptr[3] = (size_t)__ptr_00;
    __ptr[1] = __size;
    f->data = __ptr;
    if ((code *)a_00[1].error == (code *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (*(code *)a_00[1].error)(f->archive,a_00[1].current_code);
      if (iVar1 != 0) {
        free((void *)__ptr[2]);
        free(__ptr);
        f->data = (void *)0x0;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
archive_write_client_open(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;
	struct archive_none *state;
	void *buffer;
	size_t buffer_size;
	int ret;

	f->bytes_per_block = archive_write_get_bytes_per_block(f->archive);
	f->bytes_in_last_block =
	    archive_write_get_bytes_in_last_block(f->archive);
	buffer_size = f->bytes_per_block;

	state = calloc(1, sizeof(*state));
	buffer = malloc(buffer_size);
	if (state == NULL || buffer == NULL) {
		free(state);
		free(buffer);
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for output buffering");
		return (ARCHIVE_FATAL);
	}

	state->buffer_size = buffer_size;
	state->buffer = buffer;
	state->next = state->buffer;
	state->avail = state->buffer_size;
	f->data = state;

	if (a->client_opener == NULL)
		return (ARCHIVE_OK);
	ret = a->client_opener(f->archive, a->client_data);
	if (ret != ARCHIVE_OK) {
		free(state->buffer);
		free(state);
		f->data = NULL;
	}
	return (ret);
}